

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

string * __thiscall
cfd::core::CryptoUtil::EncodeBase58Check_abi_cxx11_
          (string *__return_storage_ptr__,CryptoUtil *this,ByteData *data)

{
  CfdException *this_00;
  char *wally_string;
  allocator local_5d;
  int ret;
  char *output;
  undefined1 local_50 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_array;
  
  ByteData::GetBytes(&byte_array,(ByteData *)this);
  output = (char *)0x0;
  ret = wally_base58_from_bytes
                  (byte_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)byte_array.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)byte_array.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,1,&output);
  if (ret == 0) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_
              ((string *)__return_storage_ptr__,(WallyUtil *)output,wally_string);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&byte_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_50._0_8_ = "cfdcore_util.cpp";
  local_50._8_4_ = 0x40e;
  local_50._16_8_ = "EncodeBase58Check";
  logger::warn<int&>((CfdSourceLocation *)local_50,"wally_base58_from_bytes NG[{}].",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_50,"Decode base58 error.",&local_5d);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_50);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::string CryptoUtil::EncodeBase58Check(const ByteData &data) {
  std::vector<uint8_t> byte_array = data.GetBytes();
  char *output = nullptr;

  int ret = wally_base58_from_bytes(
      byte_array.data(), byte_array.size(), BASE58_FLAG_CHECKSUM, &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_base58_from_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "Decode base58 error.");
  }
  return WallyUtil::ConvertStringAndFree(output);
}